

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::TryConsumeWhitespace(ParserImpl *this)

{
  TokenType TVar1;
  size_t __n;
  int iVar2;
  AlphaNum *in_RCX;
  bool bVar3;
  string local_a0;
  AlphaNum local_80;
  undefined8 local_50;
  char *local_48;
  
  this->had_silent_marker_ = false;
  TVar1 = (this->tokenizer_).current_.type;
  if (TVar1 == TYPE_WHITESPACE) {
    local_50 = 1;
    local_48 = " ";
    local_80.piece_._M_len = 2;
    local_80.piece_._M_str = "\t ";
    absl::lts_20250127::StrCat_abi_cxx11_(&local_a0,(lts_20250127 *)&local_50,&local_80,in_RCX);
    __n = (this->tokenizer_).current_.text._M_string_length;
    if (__n == local_a0._M_string_length) {
      if (__n == 0) {
        bVar3 = true;
      }
      else {
        iVar2 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_a0._M_dataplus._M_p,__n
                    );
        bVar3 = iVar2 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      this->had_silent_marker_ = true;
    }
    io::Tokenizer::Next(&this->tokenizer_);
  }
  return TVar1 == TYPE_WHITESPACE;
}

Assistant:

bool TryConsumeWhitespace() {
    had_silent_marker_ = false;
    if (LookingAtType(io::Tokenizer::TYPE_WHITESPACE)) {
      if (tokenizer_.current().text ==
          absl::StrCat(" ", internal::kDebugStringSilentMarkerForDetection)) {
        had_silent_marker_ = true;
      }
      tokenizer_.Next();
      return true;
    }
    return false;
  }